

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O0

int hash_to_scalar_challenge
              (VOPRF_METHOD *method,EC_SCALAR *out,EC_AFFINE *Bm,EC_AFFINE *a0,EC_AFFINE *a1,
              EC_AFFINE *a2,EC_AFFINE *a3)

{
  int iVar1;
  EC_GROUP *group_00;
  size_t local_1e0;
  size_t len;
  uint8_t transcript [346];
  CBB cbb;
  EC_GROUP *group;
  EC_AFFINE *a2_local;
  EC_AFFINE *a1_local;
  EC_AFFINE *a0_local;
  EC_AFFINE *Bm_local;
  EC_SCALAR *out_local;
  VOPRF_METHOD *method_local;
  
  group_00 = (*method->group_func)();
  iVar1 = CBB_init_fixed((CBB *)(transcript + 0x158),(uint8_t *)&len,0x15a);
  if ((((((iVar1 != 0) &&
         (iVar1 = cbb_serialize_point((CBB *)(transcript + 0x158),group_00,Bm), iVar1 != 0)) &&
        (iVar1 = cbb_serialize_point((CBB *)(transcript + 0x158),group_00,a0), iVar1 != 0)) &&
       ((iVar1 = cbb_serialize_point((CBB *)(transcript + 0x158),group_00,a1), iVar1 != 0 &&
        (iVar1 = cbb_serialize_point((CBB *)(transcript + 0x158),group_00,a2), iVar1 != 0)))) &&
      ((iVar1 = cbb_serialize_point((CBB *)(transcript + 0x158),group_00,a3), iVar1 != 0 &&
       ((iVar1 = CBB_add_bytes((CBB *)(transcript + 0x158),"Challenge",9), iVar1 != 0 &&
        (iVar1 = CBB_finish((CBB *)(transcript + 0x158),(uint8_t **)0x0,&local_1e0), iVar1 != 0)))))
      ) && (iVar1 = (*method->hash_to_scalar)(group_00,out,(uint8_t *)&len,local_1e0), iVar1 != 0))
  {
    return 1;
  }
  return 0;
}

Assistant:

static int hash_to_scalar_challenge(const VOPRF_METHOD *method, EC_SCALAR *out,
                                    const EC_AFFINE *Bm, const EC_AFFINE *a0,
                                    const EC_AFFINE *a1, const EC_AFFINE *a2,
                                    const EC_AFFINE *a3) {
  static const uint8_t kChallengeLabel[] = "Challenge";

  const EC_GROUP *group = method->group_func();
  CBB cbb;
  uint8_t transcript[5 * EC_MAX_COMPRESSED + 2 + sizeof(kChallengeLabel) - 1];
  size_t len;
  if (!CBB_init_fixed(&cbb, transcript, sizeof(transcript)) ||
      !cbb_serialize_point(&cbb, group, Bm) ||
      !cbb_serialize_point(&cbb, group, a0) ||
      !cbb_serialize_point(&cbb, group, a1) ||
      !cbb_serialize_point(&cbb, group, a2) ||
      !cbb_serialize_point(&cbb, group, a3) ||
      !CBB_add_bytes(&cbb, kChallengeLabel, sizeof(kChallengeLabel) - 1) ||
      !CBB_finish(&cbb, NULL, &len) ||
      !method->hash_to_scalar(group, out, transcript, len)) {
    return 0;
  }

  return 1;
}